

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl-ncurses.cpp
# Opt level: O3

void updateRequests_impl(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  _Elt_pointer pbVar3;
  CURLM *pCVar4;
  int *piVar5;
  CURL *pCVar6;
  long lVar7;
  array<Data,_5UL> *paVar8;
  int still_alive;
  int msgs_left;
  Data *data;
  int local_58 [2];
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  local_58[1] = 0xffffffff;
  piVar5 = (int *)curl_multi_info_read(g_cm);
  if (piVar5 != (int *)0x0) {
    do {
      if (*piVar5 == 1) {
        uVar2 = *(undefined8 *)(piVar5 + 2);
        curl_easy_getinfo(uVar2,0x100015,&local_50);
        *(undefined1 *)(local_50 + 1) = 0;
        curl_multi_remove_handle(g_cm,uVar2);
      }
      else {
        fprintf(_stderr,"E: CURLMsg (%d)\n");
      }
      piVar5 = (int *)curl_multi_info_read(g_cm,local_58 + 1);
    } while (piVar5 != (int *)0x0);
  }
  local_58[0] = 1;
  curl_multi_perform(g_cm,local_58);
  if (local_58[0] < 5) {
    while (pbVar3 = g_fetchQueue_abi_cxx11_.
                    super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur,
          ((long)g_fetchQueue_abi_cxx11_.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)g_fetchQueue_abi_cxx11_.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
          ((long)g_fetchQueue_abi_cxx11_.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)g_fetchQueue_abi_cxx11_.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
          ((((ulong)((long)g_fetchQueue_abi_cxx11_.
                           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node -
                    (long)g_fetchQueue_abi_cxx11_.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(g_fetchQueue_abi_cxx11_.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x10 !=
          0) {
      lVar7 = 5;
      paVar8 = &g_fetchData;
      while (paVar8->_M_elems[0].running == true) {
        paVar8 = (array<Data,_5UL> *)((long)paVar8 + 0x50);
        lVar7 = lVar7 + -1;
        if (lVar7 == 0) {
          return;
        }
      }
      if (lVar7 == 0) {
        return;
      }
      local_50 = (size_type *)
                 ((g_fetchQueue_abi_cxx11_.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_dataplus)._M_p;
      paVar1 = &(g_fetchQueue_abi_cxx11_.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur)->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50 == paVar1) {
        local_40 = paVar1->_M_allocated_capacity;
        uStack_38 = *(undefined8 *)
                     ((long)&(g_fetchQueue_abi_cxx11_.
                              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur)->field_2 + 8);
        local_50 = &local_40;
      }
      else {
        local_40 = paVar1->_M_allocated_capacity;
      }
      local_48 = (g_fetchQueue_abi_cxx11_.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_string_length;
      ((g_fetchQueue_abi_cxx11_.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur)->_M_dataplus)._M_p = (pointer)paVar1;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front(&g_fetchQueue_abi_cxx11_);
      g_nFetches = g_nFetches + 1;
      paVar8->_M_elems[0].running = true;
      std::__cxx11::string::_M_assign((string *)&paVar8->_M_elems[0].uri);
      pCVar4 = g_cm;
      pCVar6 = paVar8->_M_elems[0].eh;
      if (pCVar6 == (CURL *)0x0) {
        pCVar6 = (CURL *)curl_easy_init();
        paVar8->_M_elems[0].eh = pCVar6;
      }
      curl_easy_setopt(pCVar6,0x2712,local_50);
      curl_easy_setopt(pCVar6,0x2777,paVar8);
      curl_easy_setopt(pCVar6,0x4e2b,writeFunction);
      curl_easy_setopt(pCVar6,0x2711,paVar8);
      curl_multi_add_handle(pCVar4,pCVar6);
      local_58[0] = local_58[0] + 1;
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (4 < local_58[0]) {
        return;
      }
    }
  }
  return;
}

Assistant:

void updateRequests_impl() {
    CURLMsg *msg;
    int msgs_left = -1;

    while ((msg = curl_multi_info_read(g_cm, &msgs_left))) {
        if (msg->msg == CURLMSG_DONE) {
            Data* data;
            CURL *e = msg->easy_handle;
            curl_easy_getinfo(msg->easy_handle, CURLINFO_PRIVATE, &data);
            data->running = false;
            curl_multi_remove_handle(g_cm, e);
            //curl_easy_cleanup(e);
            //data->eh = NULL;
        } else {
            fprintf(stderr, "E: CURLMsg (%d)\n", msg->msg);
        }
    }

    int still_alive = 1;

    curl_multi_perform(g_cm, &still_alive);

    while (still_alive < MAX_PARALLEL && g_fetchQueue.size() > 0) {
        int idx = 0;
        while (g_fetchData[idx].running) {
            ++idx;
            if (idx == g_fetchData.size()) break;
        }
        if (idx == g_fetchData.size()) break;

        auto uri = std::move(g_fetchQueue.front());
        g_fetchQueue.pop_front();

#ifdef ENABLE_API_CACHE
        auto fname = ::getCacheFname(uri);

        std::ifstream fin(fname);
        if (fin.is_open() && fin.good()) {
            std::string str((std::istreambuf_iterator<char>(fin)), std::istreambuf_iterator<char>());
            fin.close();

            g_fetchCache[uri] = std::move(str);

            continue;
        }
#endif

        ++g_nFetches;

        g_fetchData[idx].running = true;
        g_fetchData[idx].uri = uri;
        addTransfer(g_cm, idx, std::move(uri));

        ++still_alive;
    }
}